

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_general.c
# Opt level: O0

char * concat(char *s1,char *s2)

{
  size_t local_48;
  size_t local_40;
  char *result;
  size_t len2;
  size_t len1;
  char *s2_local;
  char *s1_local;
  
  if ((s1 == (char *)0x0) && (s2 == (char *)0x0)) {
    s1_local = (char *)0x0;
  }
  else {
    if (s1 == (char *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = strlen(s1);
    }
    if (s2 == (char *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = strlen(s2);
    }
    s1_local = (char *)safeMalloc(local_40 + local_48 + 1);
    if (s1 != (char *)0x0) {
      memcpy(s1_local,s1,local_40);
    }
    if (s2 != (char *)0x0) {
      memcpy(s1_local + local_40,s2,local_48);
    }
    s1_local[local_48 + local_40] = '\0';
  }
  return s1_local;
}

Assistant:

extern char* concat( const char *s1, const char *s2 ) {

    // if both arguments are NULL, return a NULL...
    if( (s1 == NULL) && (s2 == NULL) ) return NULL;

    // get the lengths just once (optimization)...
    const size_t len1 = s1 ? strlen( s1 ) : 0;
    const size_t len2 = s2 ? strlen( s2 ) : 0;

    // get the memory required for the concatenated strings plus the terminator...
    char *result = safeMalloc( len1 + len2 + 1 );

    // build our result...
    if( s1 != NULL ) memcpy(result, s1, len1);
    if( s2 != NULL ) memcpy(result + len1, s2, len2 );

    // insert the terminator...
    *(result + len1 + len2) = 0;

    return result;
}